

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int read_png(control *control)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_3c;
  int local_38;
  png_uint_32 y;
  int pass;
  int passes;
  png_uint_32 height;
  int rc;
  png_infop info_ptr;
  png_structp png_ptr;
  control *control_local;
  
  _height = 0;
  png_ptr = (png_structp)control;
  info_ptr = (png_infop)png_create_read_struct("1.6.48.git",control,error_handler,warning_handler);
  if (info_ptr == (png_infop)0x0) {
    log_error((file *)png_ptr,2,"OOM allocating png_struct");
    *(uint *)(png_ptr + 0x18) = *(uint *)(png_ptr + 0x18) | 0x40;
    control_local._4_4_ = 2;
  }
  else {
    iVar1 = _setjmp((__jmp_buf_tag *)(png_ptr + 0x50));
    if (iVar1 == 0) {
      png_set_user_limits(info_ptr,0x7fffffff);
      png_set_chunk_cache_max(info_ptr,0);
      png_set_chunk_malloc_max(info_ptr,0);
      png_set_read_fn(info_ptr,png_ptr,read_callback);
      _height = png_create_info_struct(info_ptr);
      if (_height == 0) {
        png_error(info_ptr,"OOM allocating info structure");
      }
      if ((**(ushort **)png_ptr >> 5 & 7) != 0) {
        fprintf(_stderr," INFO\n");
      }
      png_read_info(info_ptr,_height);
      iVar2 = png_get_image_height(info_ptr,_height);
      iVar3 = png_set_interlace_handling(info_ptr);
      png_start_read_image(info_ptr);
      for (local_38 = 0; local_3c = iVar2, local_38 < iVar3; local_38 = local_38 + 1) {
        while (local_3c != 0) {
          png_read_row(info_ptr,0);
          local_3c = local_3c + -1;
        }
      }
      if ((**(ushort **)png_ptr >> 5 & 7) != 0) {
        fprintf(_stderr," END\n");
      }
      png_read_end(info_ptr,_height);
    }
    png_destroy_read_struct(&info_ptr,&height,0);
    control_local._4_4_ = iVar1;
  }
  return control_local._4_4_;
}

Assistant:

static int
read_png(struct control *control)
   /* Read a PNG, return 0 on success else an error (status) code; a bit mask as
    * defined for file::status_code as above.
    */
{
   png_structp png_ptr;
   png_infop info_ptr = NULL;
   volatile int rc;

   png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, control,
      error_handler, warning_handler);

   if (png_ptr == NULL)
   {
      /* This is not really expected. */
      log_error(&control->file, LIBPNG_ERROR_CODE, "OOM allocating png_struct");
      control->file.status_code |= INTERNAL_ERROR;
      return LIBPNG_ERROR_CODE;
   }

   rc = setjmp(control->file.jmpbuf);
   if (rc == 0)
   {
#     ifdef PNG_SET_USER_LIMITS_SUPPORTED
         /* Remove any limits on the size of PNG files that can be read,
          * without this we may reject files based on built-in safety
          * limits.
          */
         png_set_user_limits(png_ptr, 0x7fffffff, 0x7fffffff);
         png_set_chunk_cache_max(png_ptr, 0);
         png_set_chunk_malloc_max(png_ptr, 0);
#     endif

      png_set_read_fn(png_ptr, control, read_callback);

      info_ptr = png_create_info_struct(png_ptr);
      if (info_ptr == NULL)
         png_error(png_ptr, "OOM allocating info structure");

      if (control->file.global->verbose)
         fprintf(stderr, " INFO\n");

      png_read_info(png_ptr, info_ptr);

      {
        png_uint_32 height = png_get_image_height(png_ptr, info_ptr);
        int passes = png_set_interlace_handling(png_ptr);
        int pass;

        png_start_read_image(png_ptr);

        for (pass = 0; pass < passes; ++pass)
        {
           png_uint_32 y = height;

           /* NOTE: this skips asking libpng to return either version of
            * the image row, but libpng still reads the rows.
            */
           while (y-- > 0)
              png_read_row(png_ptr, NULL, NULL);
        }
      }

      if (control->file.global->verbose)
         fprintf(stderr, " END\n");

      /* Make sure to read to the end of the file: */
      png_read_end(png_ptr, info_ptr);
   }

   png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
   return rc;
}